

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVector.h
# Opt level: O2

void __thiscall
__gnu_cxx::new_allocator<chrono::geometry::ChLineSegment>::
construct<chrono::geometry::ChLineSegment,chrono::ChVector<double>const&,chrono::ChVector<double>const&>
          (new_allocator<chrono::geometry::ChLineSegment> *this,ChLineSegment *__p,
          ChVector<double> *__args,ChVector<double> *__args_1)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  
  dVar1 = __args->m_data[2];
  auVar4._8_8_ = dVar1;
  auVar4._0_8_ = dVar1;
  auVar4._16_8_ = dVar1;
  auVar4._24_8_ = dVar1;
  auVar2 = *(undefined1 (*) [16])__args->m_data;
  dVar1 = __args_1->m_data[0];
  auVar5._8_8_ = dVar1;
  auVar5._0_8_ = dVar1;
  auVar5._16_8_ = dVar1;
  auVar5._24_8_ = dVar1;
  (__p->super_ChLine).closed = false;
  (__p->super_ChLine).complexityU = 2;
  (__p->super_ChLine).super_ChGeometry._vptr_ChGeometry = (_func_int **)&PTR__ChGeometry_01189830;
  auVar4 = vblendps_avx(ZEXT1632(auVar2),auVar4,0x30);
  dVar1 = __args_1->m_data[1];
  dVar3 = __args_1->m_data[2];
  auVar4 = vblendps_avx(auVar4,auVar5,0xc0);
  __p->pA = (ChVector<double>)auVar4._0_24_;
  (__p->pB).m_data[0] = (double)auVar4._24_8_;
  (__p->pB).m_data[1] = dVar1;
  (__p->pB).m_data[2] = dVar3;
  return;
}

Assistant:

inline ChVector<Real>::ChVector(const ChVector<Real>& other) {
    m_data[0] = other.m_data[0];
    m_data[1] = other.m_data[1];
    m_data[2] = other.m_data[2];
}